

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::forward_int8_x86
          (ConvolutionDepthWise_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  float *pfVar6;
  Layer *pLVar7;
  float fVar8;
  uint uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined4 uVar14;
  size_t sVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  undefined8 uVar18;
  undefined1 uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  void *pvVar23;
  uint *puVar24;
  int remain_3;
  int iVar25;
  undefined1 *puVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  undefined4 uVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  ulong uVar34;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  long lVar35;
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [16];
  float *pfVar38;
  void *pvVar39;
  long lVar40;
  int iVar41;
  int k;
  uint _elempack;
  ulong uVar42;
  void *pvVar43;
  undefined4 *puVar44;
  int g;
  int iVar45;
  uint uVar46;
  ulong uVar47;
  int g_2;
  int iVar48;
  uint _elempack_00;
  ulong uVar49;
  void *pvVar50;
  bool bVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [12];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  __m128 pos;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  __m128 _b;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  __m128 min;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  __m128 pos_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  ulong local_350;
  float *local_338;
  byte local_318;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  long local_2f0;
  Mat local_2d8;
  ulong local_290;
  Option opt_q;
  float top_rescale;
  int iStack_234;
  Allocator *pAStack_230;
  Allocator *pAStack_228;
  int iStack_220;
  undefined4 uStack_21c;
  Allocator *local_218;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  int iStack_200;
  undefined4 uStack_1fc;
  size_t local_1f8;
  pointer local_1e8;
  long local_1e0;
  undefined4 *local_1d8;
  void *local_1d0;
  ulong local_1c8;
  long local_1c0;
  ulong local_1b8;
  float scale_out;
  undefined4 uStack_1ac;
  int *local_1a8;
  Allocator *local_1a0;
  int local_198;
  long *local_190;
  int local_188;
  bool bStack_184;
  bool bStack_183;
  bool bStack_182;
  bool bStack_181;
  int iStack_180;
  bool bStack_17c;
  bool bStack_17b;
  bool bStack_17a;
  bool bStack_179;
  int local_178;
  ulong local_170;
  Mat local_168;
  Mat m_1;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  _Vector_base<float,_std::allocator<float>_> local_c0;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  Option opt_g;
  
  _b = in_ZMM7._0_16_;
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  iVar25 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar45 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar28 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar41 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar3 = bottom_blob->refcount;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    iVar48 = local_168.elempack * local_168.c;
    iVar32 = (this->super_ConvolutionDepthWise).group;
    local_2d8.cstep = 0;
    local_2d8.data = (undefined4 *)0x0;
    local_2d8.refcount._0_4_ = 0;
    local_2d8.refcount._4_4_ = 0;
    local_2d8.elemsize = 0;
    local_2d8.elempack = 0;
    local_2d8.allocator = (Allocator *)0x0;
    local_2d8.dims = 0;
    local_2d8.w = 0;
    local_2d8.h = 0;
    local_2d8.d = 0;
    local_2d8.c = 0;
    uVar47 = 0;
    Mat::create(&local_2d8,iVar48,4,(Allocator *)0x0);
    iVar22 = -100;
    iVar48 = iVar48 / iVar32;
    uVar46 = (this->super_ConvolutionDepthWise).group;
    if (iVar48 < 1) {
      iVar48 = 0;
    }
    pvVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
    puVar44 = (undefined4 *)local_2d8.data;
    uVar49 = (ulong)uVar46;
    if ((int)uVar46 < 1) {
      uVar49 = uVar47;
    }
    for (; uVar47 != uVar49; uVar47 = uVar47 + 1) {
      uVar30 = *(undefined4 *)((long)pvVar4 + uVar47 * 4);
      iVar32 = iVar48;
      while (bVar51 = iVar32 != 0, iVar32 = iVar32 + -1, bVar51) {
        *puVar44 = uVar30;
        puVar44 = puVar44 + 1;
      }
    }
    uVar10 = opt->lightmode;
    uVar11 = opt->use_shader_pack8;
    uVar12 = opt->use_subgroup_ops;
    uVar13 = opt->use_reserved_0;
    uVar14 = opt->num_threads;
    opt_q.num_threads = uVar14;
    opt_q.use_reserved_0 = (bool)uVar13;
    opt_q.use_subgroup_ops = (bool)uVar12;
    opt_q.use_shader_pack8 = (bool)uVar11;
    opt_q.lightmode = (bool)uVar10;
    opt_q.workspace_allocator = opt->workspace_allocator;
    opt_q.openmp_blocktime = opt->openmp_blocktime;
    opt_q.use_winograd_convolution = opt->use_winograd_convolution;
    opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_q.use_int8_inference = opt->use_int8_inference;
    opt_q.use_vulkan_compute = opt->use_vulkan_compute;
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.vulkan_device_index = opt->vulkan_device_index;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_q.use_fp16_uniform = opt->use_fp16_uniform;
    opt_q.use_int8_uniform = opt->use_int8_uniform;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator = opt->workspace_allocator;
    in_ZMM7 = ZEXT1664((undefined1  [16])_b);
    quantize_to_int8(bottom_blob,&local_168,&local_2d8,&opt_q);
    bVar51 = local_168.data == (void *)0x0;
    lVar33 = (long)local_168.c * local_168.cstep;
    piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_2d8.allocator == (Allocator *)0x0) {
          free(local_2d8.data);
        }
        else {
          (*(local_2d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar51 || lVar33 == 0) goto LAB_003b427f;
  }
  local_2d8.cstep = 0;
  local_2d8.data = (undefined4 *)0x0;
  local_2d8.refcount._0_4_ = 0;
  local_2d8.refcount._4_4_ = 0;
  local_2d8.elemsize = 0;
  local_2d8.elempack = 0;
  local_2d8.allocator = (Allocator *)0x0;
  local_2d8.dims = 0;
  local_2d8.w = 0;
  local_2d8.h = 0;
  local_2d8.d = 0;
  local_2d8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_168,&local_2d8,opt);
  uVar46 = local_2d8.c;
  iVar48 = local_2d8.w;
  iVar32 = local_2d8.elempack;
  iVar22 = -100;
  if (((undefined4 *)local_2d8.data != (undefined4 *)0x0) &&
     (local_2d8.cstep * (long)local_2d8.c != 0)) {
    iVar25 = (~((iVar25 + -1) * iVar28) + local_2d8.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar45 = (~((iVar45 + -1) * iVar41) + local_2d8.h) / (this->super_ConvolutionDepthWise).stride_h
    ;
    iVar28 = iVar25 + 1;
    iVar41 = iVar45 + 1;
    uVar27 = local_2d8.elempack * local_2d8.c;
    _elempack_00 = 8;
    if ((uVar27 == (this->super_ConvolutionDepthWise).group) &&
       (uVar27 == (this->super_ConvolutionDepthWise).num_output)) {
      if (opt->use_packing_layout == false) {
        _elempack_00 = 1;
      }
      if ((uVar27 & 7) != 0) {
        _elempack_00 = 1;
      }
      iVar2 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar9 = _elempack_00 * 4;
      if (100 < iVar2) {
        uVar9 = _elempack_00;
      }
      Mat::create(top_blob,iVar28,iVar41,(int)uVar27 / (int)_elempack_00,(ulong)uVar9,_elempack_00,
                  opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar22 = 0;
        if (iVar32 == 1) {
          iVar28 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar41 = (this->super_ConvolutionDepthWise).kernel_h;
          auVar164._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
          auVar164._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
          auVar164._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
          auVar164._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
          auVar190._8_4_ = 1;
          auVar190._0_8_ = 0x100000001;
          auVar190._12_4_ = 1;
          uVar46 = (this->super_ConvolutionDepthWise).activation_type;
          auVar175._0_8_ = auVar164._0_8_ ^ 0x100000001;
          auVar175._8_4_ = auVar164._8_4_ ^ 1;
          auVar175._12_4_ = auVar164._12_4_ ^ 1;
          auVar92 = ZEXT1664(auVar175);
          if ((1 < uVar46 || (iVar41 != 3 || iVar28 != 3)) || auVar175 != (undefined1  [16])0x0) {
            auVar190 = vpcmpeqd_avx(auVar164,auVar190);
            uVar30 = vmovmskps_avx(auVar190);
            if (((iVar41 != 3 || iVar28 != 3) || 1 < uVar46) ||
                ((auVar164._12_4_ != 2 || auVar164._8_4_ != 2) || (~(byte)uVar30 & 3) != 0)) {
              uVar46 = iVar41 * iVar28;
              local_290 = (ulong)(int)uVar46;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,local_290,
                         (allocator_type *)&top_rescale);
              iVar28 = (this->super_ConvolutionDepthWise).dilation_h;
              uVar16 = opt_q._0_8_;
              iVar41 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar32 = (this->super_ConvolutionDepthWise).dilation_w * iVar41;
              lVar33 = 0;
              iVar22 = 0;
              for (iVar29 = 0; iVar29 < (this->super_ConvolutionDepthWise).kernel_h;
                  iVar29 = iVar29 + 1) {
                for (lVar35 = 0; (int)lVar35 < iVar41; lVar35 = lVar35 + 1) {
                  *(int *)((long)(int)lVar33 * 4 + opt_q._0_8_ + lVar35 * 4) = iVar22;
                  iVar22 = iVar22 + (this->super_ConvolutionDepthWise).dilation_w;
                  iVar41 = (this->super_ConvolutionDepthWise).kernel_w;
                }
                iVar22 = iVar22 + (iVar48 * iVar28 - iVar32);
                lVar33 = (int)lVar33 + lVar35;
              }
              local_2f0 = 0;
              if ((int)uVar46 < 1) {
                uVar46 = 0;
              }
              auVar92 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              for (lVar33 = 0; pvVar4 = local_2d8.data,
                  lVar33 < (this->super_ConvolutionDepthWise).group; lVar33 = lVar33 + 1) {
                pfVar38 = (float *)(top_blob->elemsize * lVar33 * top_blob->cstep +
                                   (long)top_blob->data);
                lVar20 = local_2d8.cstep * lVar33 * local_2d8.elemsize;
                lVar35 = (long)local_2d8.w * local_2d8.elemsize;
                pvVar5 = (this->weight_data_tm).data;
                local_338 = pfVar38;
                for (iVar28 = 0; iVar28 <= iVar45; iVar28 = iVar28 + 1) {
                  for (iVar41 = 0; iVar41 <= iVar25; iVar41 = iVar41 + 1) {
                    iVar32 = 0;
                    for (uVar47 = 0; uVar46 != uVar47; uVar47 = uVar47 + 1) {
                      iVar32 = iVar32 + (int)*(char *)((long)pvVar5 + uVar47 + local_2f0) *
                                        (int)*(char *)((long)pvVar4 +
                                                      (long)*(int *)(uVar16 + uVar47 * 4) +
                                                      (long)iVar28 *
                                                      (long)(this->super_ConvolutionDepthWise).
                                                            stride_h * lVar35 +
                                                      (long)iVar41 *
                                                      (long)(this->super_ConvolutionDepthWise).
                                                            stride_w + lVar20);
                    }
                    fVar53 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                              weight_data_int8_scales.data + lVar33 * 4);
                    fVar52 = 0.0;
                    if (fVar53 != 0.0) {
                      fVar52 = 1.0 / (fVar53 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                                bottom_blob_int8_scales.data +
                                                         lVar33 * 4));
                    }
                    fVar52 = fVar52 * (float)iVar32;
                    if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                      fVar52 = fVar52 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                         bias_data.data + lVar33 * 4);
                    }
                    auVar164 = ZEXT416((uint)fVar52);
                    fVar53 = fVar52;
                    switch((this->super_ConvolutionDepthWise).activation_type) {
                    case 1:
                      auVar164 = vmaxss_avx(auVar164,ZEXT416(0));
                      fVar53 = auVar164._0_4_;
                      break;
                    case 2:
                      auVar164 = vcmpss_avx(ZEXT816(0) << 0x20,auVar164,1);
                      auVar82._8_4_ = 0x3f800000;
                      auVar82._0_8_ = 0x3f8000003f800000;
                      auVar82._12_4_ = 0x3f800000;
                      auVar164 = vblendvps_avx(ZEXT416(*(this->super_ConvolutionDepthWise).
                                                        activation_params.data),auVar82,auVar164);
                      fVar53 = auVar164._0_4_ * fVar52;
                      break;
                    case 3:
                      puVar24 = (uint *)(this->super_ConvolutionDepthWise).activation_params.data;
                      fVar52 = (float)puVar24[1];
                      auVar164 = vmaxss_avx(auVar164,ZEXT416(*puVar24));
                      fVar53 = auVar164._0_4_;
                      if (fVar52 < auVar164._0_4_) {
                        fVar53 = fVar52;
                      }
                      break;
                    case 4:
                      auVar164 = vminss_avx(auVar164,ZEXT416(0x42b0c0a5));
                      auVar62._0_4_ = auVar164._0_4_ ^ auVar92._0_4_;
                      auVar62._4_4_ = auVar164._4_4_ ^ auVar92._4_4_;
                      auVar62._8_4_ = auVar164._8_4_ ^ auVar92._8_4_;
                      auVar62._12_4_ = auVar164._12_4_ ^ auVar92._12_4_;
                      auVar164 = vcmpss_avx(auVar164,ZEXT416(0xc2b0c0a5),1);
                      auVar81._8_4_ = 0x42b0c0a5;
                      auVar81._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar81._12_4_ = 0x42b0c0a5;
                      auVar164 = vblendvps_avx(auVar62,auVar81,auVar164);
                      fVar53 = expf(auVar164._0_4_);
                      auVar92 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      fVar53 = 1.0 / (fVar53 + 1.0);
                      break;
                    case 5:
                      fVar53 = expf(fVar52);
                      fVar53 = logf(fVar53 + 1.0);
                      fVar53 = tanhf(fVar53);
                      auVar92 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      fVar53 = fVar53 * fVar52;
                      break;
                    case 6:
                      pfVar6 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                      fVar8 = *pfVar6;
                      fVar1 = pfVar6[1];
                      fVar85 = (float)((uint)fVar1 ^ auVar92._0_4_) / fVar8;
                      fVar53 = 0.0;
                      if ((fVar85 <= fVar52) && (fVar53 = fVar52, fVar52 <= fVar85 + 1.0 / fVar8)) {
                        auVar164 = vfmadd213ss_fma(ZEXT416((uint)fVar8),auVar164,
                                                   ZEXT416((uint)fVar1));
                        fVar53 = auVar164._0_4_ * fVar52;
                      }
                    }
                    if (iVar2 < 0x65) {
                      *local_338 = fVar53;
                      local_338 = local_338 + 1;
                    }
                    else {
                      fVar53 = fVar53 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                         top_blob_int8_scales.data + lVar33 * 4);
                      auVar164 = vandps_avx(ZEXT416((uint)fVar53),auVar92._0_16_);
                      auVar83._8_4_ = 0x3effffff;
                      auVar83._0_8_ = 0x3effffff3effffff;
                      auVar83._12_4_ = 0x3effffff;
                      auVar164 = vorps_avx(auVar164,auVar83);
                      auVar164 = ZEXT416((uint)(fVar53 + auVar164._0_4_));
                      auVar164 = vroundss_avx(auVar164,auVar164,0xb);
                      iVar32 = (int)auVar164._0_4_;
                      if (iVar32 < -0x7e) {
                        iVar32 = -0x7f;
                      }
                      uVar19 = (undefined1)iVar32;
                      if (0x7e < iVar32) {
                        uVar19 = 0x7f;
                      }
                      *(undefined1 *)pfVar38 = uVar19;
                      pfVar38 = (float *)((long)pfVar38 + 1);
                    }
                  }
                }
                local_2f0 = local_2f0 + local_290;
              }
              goto LAB_003b369b;
            }
            if (iVar2 < 0x65) {
              opt_q._0_16_ = ZEXT816(0) << 0x20;
              opt_q.workspace_allocator = (Allocator *)0x0;
              lVar33 = 0;
              while( true ) {
                auVar84 = auVar92._4_12_;
                if ((this->super_ConvolutionDepthWise).group <= lVar33) break;
                _top_rescale = (void *)CONCAT44(iStack_234,
                                                1.0 / (*(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + lVar33 * 4) *
                                                  *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            lVar33 * 4)));
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
                lVar33 = lVar33 + 1;
              }
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_d8,
                         (vector<float,_std::allocator<float>_> *)&opt_q);
              iVar25 = top_blob->w;
              iVar45 = top_blob->h;
              pvVar4 = (this->super_ConvolutionDepthWise).bias_data.data;
              pvVar5 = (this->weight_data_tm).data;
              uVar47 = top_blob->elemsize;
              lVar33 = top_blob->cstep * uVar47;
              local_290 = (long)iVar45 * (long)iVar25;
              local_1b8 = uVar47 * local_290 + 0xf & 0xfffffffffffffff0;
              local_1c0 = local_2d8.elemsize * local_2d8.cstep;
              iVar28 = 0;
              if (0 < iVar45) {
                iVar28 = iVar45;
              }
              iVar45 = top_blob->d;
              local_1c8 = CONCAT44(local_1c8._4_4_,iVar45);
              local_1d0 = top_blob->data;
              lVar35 = (long)((local_2d8.w - iVar25) * 2);
              uVar46 = top_blob->c;
              if (top_blob->c < 1) {
                uVar46 = 0;
              }
              iVar41 = top_blob->dims;
              local_1d8 = (undefined4 *)local_2d8.data;
              local_1e0 = (long)local_2d8.w * 2;
              local_1e8 = local_d8._M_impl.super__Vector_impl_data._M_start;
              pvVar50 = local_1d0;
              for (uVar49 = 0; uVar49 != uVar46; uVar49 = uVar49 + 1) {
                iVar32 = (int)(local_1b8 / uVar47);
                if (iVar41 == 4) {
                  iVar32 = (int)local_290;
                }
                if (pvVar4 == (void *)0x0) {
                  uVar30 = 0;
                }
                else {
                  uVar30 = *(undefined4 *)((long)pvVar4 + uVar49 * 4);
                }
                puVar24 = (uint *)(lVar33 * uVar49 + (long)local_1d0);
                fVar53 = local_d8._M_impl.super__Vector_impl_data._M_start[uVar49];
                iVar32 = iVar32 * iVar45;
                if (iVar32 < 1) {
                  iVar32 = 0;
                }
                for (lVar20 = 0; iVar32 != (int)lVar20; lVar20 = lVar20 + 1) {
                  *(undefined4 *)((long)pvVar50 + lVar20 * 4) = uVar30;
                }
                lVar21 = uVar49 * 9;
                puVar44 = (undefined4 *)(local_1c0 * uVar49 + (long)local_2d8.data);
                lVar20 = (long)puVar44 + (long)local_2d8.w;
                lVar31 = (long)puVar44 + local_1e0;
                for (iVar32 = 0; iVar32 != iVar28; iVar32 = iVar32 + 1) {
                  lVar40 = 0;
                  for (iVar48 = iVar25; 0 < iVar48; iVar48 = iVar48 + -1) {
                    auVar65._0_4_ =
                         (float)((int)*(char *)((long)pvVar5 + lVar21 + 8) *
                                 (int)*(char *)(lVar31 + 2 + lVar40) +
                                 (int)*(char *)((long)pvVar5 + lVar21 + 7) *
                                 (int)*(char *)(lVar31 + 1 + lVar40) +
                                (int)*(char *)((long)pvVar5 + lVar21 + 6) *
                                (int)*(char *)(lVar31 + lVar40) +
                                (int)*(char *)((long)pvVar5 + lVar21 + 5) *
                                (int)*(char *)(lVar20 + 2 + lVar40) +
                                (int)*(char *)((long)pvVar5 + lVar21 + 4) *
                                (int)*(char *)(lVar20 + 1 + lVar40) +
                                (int)*(char *)((long)pvVar5 + lVar21 + 3) *
                                (int)*(char *)(lVar20 + lVar40) +
                                (int)*(char *)((long)pvVar5 + lVar21 + 2) *
                                (int)*(char *)((long)puVar44 + lVar40 + 2) +
                                (int)*(char *)((long)pvVar5 + lVar21 + 1) *
                                (int)*(char *)((long)puVar44 + lVar40 + 1) +
                                (int)*(char *)((long)pvVar5 + lVar21) *
                                (int)*(char *)((long)puVar44 + lVar40));
                    auVar65._4_12_ = auVar84;
                    auVar164 = vfmadd213ss_fma(auVar65,ZEXT416((uint)fVar53),ZEXT416(*puVar24));
                    *puVar24 = auVar164._0_4_;
                    puVar24 = puVar24 + 1;
                    lVar40 = lVar40 + 2;
                  }
                  puVar44 = (undefined4 *)((long)puVar44 + lVar40 + lVar35);
                  lVar20 = lVar20 + lVar35 + lVar40;
                  lVar31 = lVar31 + lVar35 + lVar40;
                }
                pvVar50 = (void *)((long)pvVar50 + lVar33);
              }
              this_00 = &local_d8;
            }
            else {
              opt_q._0_16_ = ZEXT816(0) << 0x20;
              opt_q.workspace_allocator = (Allocator *)0x0;
              for (lVar33 = 0; auVar84 = in_ZMM7._4_12_,
                  lVar33 < (this->super_ConvolutionDepthWise).group; lVar33 = lVar33 + 1) {
                fVar53 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales
                                          .data + lVar33 * 4);
                fVar52 = 0.0;
                if (fVar53 != 0.0) {
                  fVar52 = 1.0 / (fVar53 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                            bottom_blob_int8_scales.data +
                                                     lVar33 * 4));
                }
                _top_rescale = (void *)CONCAT44(iStack_234,fVar52);
                _scale_out = (void *)CONCAT44(uStack_1ac,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar33 * 4));
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_c0,
                         (vector<float,_std::allocator<float>_> *)&opt_q);
              iVar25 = top_blob->w;
              iVar45 = top_blob->h;
              pvVar4 = (this->super_ConvolutionDepthWise).bias_data.data;
              pvVar5 = (this->weight_data_tm).data;
              lVar33 = (long)((local_2d8.w - iVar25) * 2);
              uVar47 = 0;
              if (iVar45 < 1) {
                iVar45 = 0;
              }
              uVar49 = (ulong)(uint)top_blob->c;
              if (top_blob->c < 1) {
                uVar49 = uVar47;
              }
              auVar55._8_4_ = 0x80000000;
              auVar55._0_8_ = 0x8000000080000000;
              auVar55._12_4_ = 0x80000000;
              auVar66._8_4_ = 0x3effffff;
              auVar66._0_8_ = 0x3effffff3effffff;
              auVar66._12_4_ = 0x3effffff;
              for (; uVar47 != uVar49; uVar47 = uVar47 + 1) {
                if (pvVar4 == (void *)0x0) {
                  auVar164 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar164 = ZEXT416(*(uint *)((long)pvVar4 + uVar47 * 4));
                }
                puVar26 = (undefined1 *)
                          (top_blob->cstep * uVar47 * top_blob->elemsize + (long)top_blob->data);
                fVar53 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar47 * 2];
                fVar52 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar47 * 2 + 1];
                puVar44 = (undefined4 *)
                          (local_2d8.cstep * uVar47 * local_2d8.elemsize + (long)local_2d8.data);
                lVar31 = uVar47 * 9;
                lVar35 = (long)puVar44 + (long)local_2d8.w;
                lVar20 = (long)puVar44 + (long)local_2d8.w * 2;
                for (iVar28 = 0; iVar28 != iVar45; iVar28 = iVar28 + 1) {
                  lVar21 = 0;
                  for (iVar41 = iVar25; 0 < iVar41; iVar41 = iVar41 + -1) {
                    auVar110._0_4_ =
                         (float)((int)*(char *)((long)pvVar5 + lVar31 + 8) *
                                 (int)*(char *)(lVar20 + 2 + lVar21) +
                                 (int)*(char *)((long)pvVar5 + lVar31 + 7) *
                                 (int)*(char *)(lVar20 + 1 + lVar21) +
                                (int)*(char *)((long)pvVar5 + lVar31 + 6) *
                                (int)*(char *)(lVar20 + lVar21) +
                                (int)*(char *)((long)pvVar5 + lVar31 + 5) *
                                (int)*(char *)(lVar35 + 2 + lVar21) +
                                (int)*(char *)((long)pvVar5 + lVar31 + 4) *
                                (int)*(char *)(lVar35 + 1 + lVar21) +
                                (int)*(char *)((long)pvVar5 + lVar31 + 3) *
                                (int)*(char *)(lVar35 + lVar21) +
                                (int)*(char *)((long)pvVar5 + lVar31 + 2) *
                                (int)*(char *)((long)puVar44 + lVar21 + 2) +
                                (int)*(char *)((long)pvVar5 + lVar31 + 1) *
                                (int)*(char *)((long)puVar44 + lVar21 + 1) +
                                (int)*(char *)((long)pvVar5 + lVar31) *
                                (int)*(char *)((long)puVar44 + lVar21));
                    auVar110._4_12_ = auVar84;
                    auVar190 = vfmadd213ss_fma(auVar110,ZEXT416((uint)fVar53),auVar164);
                    fVar8 = auVar190._0_4_ * fVar52;
                    auVar190 = vandps_avx(ZEXT416((uint)fVar8),auVar55);
                    auVar190 = vorps_avx(auVar190,auVar66);
                    auVar190 = ZEXT416((uint)(fVar8 + auVar190._0_4_));
                    auVar190 = vroundss_avx(auVar190,auVar190,0xb);
                    iVar32 = (int)auVar190._0_4_;
                    if (iVar32 < -0x7e) {
                      iVar32 = -0x7f;
                    }
                    if (0x7e < iVar32) {
                      iVar32 = 0x7f;
                    }
                    *puVar26 = (char)iVar32;
                    puVar26 = puVar26 + 1;
                    lVar21 = lVar21 + 2;
                  }
                  puVar44 = (undefined4 *)((long)puVar44 + lVar21 + lVar33);
                  lVar35 = lVar35 + lVar33 + lVar21;
                  lVar20 = lVar20 + lVar33 + lVar21;
                }
              }
              this_00 = &local_c0;
            }
          }
          else if (iVar2 < 0x65) {
            opt_q._0_16_ = ZEXT816(0) << 0x20;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar33 = 0; auVar84 = auVar92._4_12_,
                lVar33 < (this->super_ConvolutionDepthWise).group; lVar33 = lVar33 + 1) {
              _top_rescale = (void *)CONCAT44(iStack_234,
                                              1.0 / (*(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + lVar33 * 4) *
                                                  *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            lVar33 * 4)));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar25 = top_blob->w;
            iVar45 = top_blob->h;
            pvVar4 = (this->super_ConvolutionDepthWise).bias_data.data;
            pvVar5 = (this->weight_data_tm).data;
            iVar28 = top_blob->d;
            pvVar50 = top_blob->data;
            local_290 = top_blob->elemsize;
            local_1b8 = top_blob->cstep * local_290;
            local_1c0 = (long)iVar45 * (long)iVar25;
            local_1c8 = local_290 * local_1c0 + 0xf & 0xfffffffffffffff0;
            local_1d0 = (void *)(local_2d8.elemsize * local_2d8.cstep);
            iVar41 = 0;
            if (0 < iVar45) {
              iVar41 = iVar45;
            }
            iVar45 = top_blob->dims;
            uVar46 = top_blob->c;
            if (top_blob->c < 1) {
              uVar46 = 0;
            }
            local_1d8 = (undefined4 *)local_2d8.data;
            local_1e0 = (long)local_2d8.w * 2;
            local_1e8 = local_a8._M_impl.super__Vector_impl_data._M_start;
            pvVar39 = pvVar50;
            for (uVar47 = 0; uVar47 != uVar46; uVar47 = uVar47 + 1) {
              iVar32 = (int)(local_1c8 / local_290);
              if (iVar45 == 4) {
                iVar32 = (int)local_1c0;
              }
              if (pvVar4 == (void *)0x0) {
                uVar30 = 0;
              }
              else {
                uVar30 = *(undefined4 *)((long)pvVar4 + uVar47 * 4);
              }
              fVar53 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar47];
              iVar32 = iVar32 * iVar28;
              if (iVar32 < 1) {
                iVar32 = 0;
              }
              for (lVar33 = 0; iVar32 != (int)lVar33; lVar33 = lVar33 + 1) {
                *(undefined4 *)((long)pvVar39 + lVar33 * 4) = uVar30;
              }
              lVar20 = uVar47 * 9;
              puVar44 = (undefined4 *)((long)local_1d0 * uVar47 + (long)local_2d8.data);
              lVar33 = (long)local_2d8.w + (long)puVar44;
              lVar35 = local_1e0 + (long)puVar44;
              pvVar43 = (void *)(local_1b8 * uVar47 + (long)pvVar50);
              for (iVar32 = 0; iVar32 != iVar41; iVar32 = iVar32 + 1) {
                lVar31 = 0;
                pvVar23 = pvVar43;
                for (uVar49 = (long)iVar25; 0 < (int)uVar49; uVar49 = (ulong)((int)uVar49 - 1)) {
                  auVar63._0_4_ =
                       (float)((int)*(char *)((long)pvVar5 + lVar20 + 8) *
                               (int)*(char *)(lVar35 + 2 + lVar31) +
                               (int)*(char *)((long)pvVar5 + lVar20 + 7) *
                               (int)*(char *)(lVar35 + 1 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar20 + 6) *
                              (int)*(char *)(lVar35 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar20 + 5) *
                              (int)*(char *)(lVar33 + 2 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar20 + 4) *
                              (int)*(char *)(lVar33 + 1 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar20 + 3) *
                              (int)*(char *)(lVar33 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar20 + 2) *
                              (int)*(char *)((long)puVar44 + lVar31 + 2) +
                              (int)*(char *)((long)pvVar5 + lVar20 + 1) *
                              (int)*(char *)((long)puVar44 + lVar31 + 1) +
                              (int)*(char *)((long)pvVar5 + lVar20) *
                              (int)*(char *)((long)puVar44 + lVar31));
                  auVar63._4_12_ = auVar84;
                  auVar164 = vfmadd213ss_fma(auVar63,ZEXT416((uint)fVar53),
                                             ZEXT416(*(uint *)((long)pvVar43 + lVar31 * 4)));
                  *(int *)((long)pvVar43 + lVar31 * 4) = auVar164._0_4_;
                  pvVar23 = (void *)((long)pvVar23 + 4);
                  lVar31 = lVar31 + 1;
                }
                puVar44 = (undefined4 *)((long)puVar44 + lVar31 + 2);
                lVar33 = lVar33 + lVar31 + 2;
                lVar35 = lVar35 + lVar31 + 2;
                pvVar43 = pvVar23;
              }
              pvVar39 = (void *)((long)pvVar39 + local_1b8);
            }
            this_00 = &local_a8;
          }
          else {
            opt_q._0_16_ = ZEXT816(0) << 0x20;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar33 = 0; auVar84 = in_ZMM7._4_12_,
                lVar33 < (this->super_ConvolutionDepthWise).group; lVar33 = lVar33 + 1) {
              fVar53 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.
                                        data + lVar33 * 4);
              fVar52 = 0.0;
              if (fVar53 != 0.0) {
                fVar52 = 1.0 / (fVar53 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                          bottom_blob_int8_scales.data + lVar33 * 4)
                               );
              }
              _top_rescale = (void *)CONCAT44(iStack_234,fVar52);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             ((long)(this->super_ConvolutionDepthWise).
                                                    top_blob_int8_scales.data + lVar33 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_90,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar25 = top_blob->w;
            iVar45 = top_blob->h;
            pvVar4 = (this->super_ConvolutionDepthWise).bias_data.data;
            pvVar5 = (this->weight_data_tm).data;
            uVar47 = 0;
            if (iVar45 < 1) {
              iVar45 = 0;
            }
            uVar49 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar49 = uVar47;
            }
            auVar54._8_4_ = 0x80000000;
            auVar54._0_8_ = 0x8000000080000000;
            auVar54._12_4_ = 0x80000000;
            auVar64._8_4_ = 0x3effffff;
            auVar64._0_8_ = 0x3effffff3effffff;
            auVar64._12_4_ = 0x3effffff;
            for (; uVar47 != uVar49; uVar47 = uVar47 + 1) {
              if (pvVar4 == (void *)0x0) {
                auVar164 = ZEXT816(0) << 0x40;
              }
              else {
                auVar164 = ZEXT416(*(uint *)((long)pvVar4 + uVar47 * 4));
              }
              pvVar50 = (void *)(top_blob->cstep * uVar47 * top_blob->elemsize +
                                (long)top_blob->data);
              fVar53 = local_90._M_impl.super__Vector_impl_data._M_start[uVar47 * 2];
              fVar52 = local_90._M_impl.super__Vector_impl_data._M_start[uVar47 * 2 + 1];
              puVar44 = (undefined4 *)
                        (local_2d8.cstep * uVar47 * local_2d8.elemsize + (long)local_2d8.data);
              lVar35 = uVar47 * 9;
              lVar33 = (long)puVar44 + (long)local_2d8.w;
              lVar20 = (long)local_2d8.w * 2 + (long)puVar44;
              for (iVar28 = 0; iVar28 != iVar45; iVar28 = iVar28 + 1) {
                lVar31 = 0;
                for (iVar41 = iVar25; 0 < iVar41; iVar41 = iVar41 + -1) {
                  auVar109._0_4_ =
                       (float)((int)*(char *)((long)pvVar5 + lVar35 + 8) *
                               (int)*(char *)(lVar20 + 2 + lVar31) +
                               (int)*(char *)((long)pvVar5 + lVar35 + 7) *
                               (int)*(char *)(lVar20 + 1 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar35 + 6) *
                              (int)*(char *)(lVar20 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar35 + 5) *
                              (int)*(char *)(lVar33 + 2 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar35 + 4) *
                              (int)*(char *)(lVar33 + 1 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar35 + 3) *
                              (int)*(char *)(lVar33 + lVar31) +
                              (int)*(char *)((long)pvVar5 + lVar35 + 2) *
                              (int)*(char *)((long)puVar44 + lVar31 + 2) +
                              (int)*(char *)((long)pvVar5 + lVar35 + 1) *
                              (int)*(char *)((long)puVar44 + lVar31 + 1) +
                              (int)*(char *)((long)pvVar5 + lVar35) *
                              (int)*(char *)((long)puVar44 + lVar31));
                  auVar109._4_12_ = auVar84;
                  auVar190 = vfmadd213ss_fma(auVar109,ZEXT416((uint)fVar53),auVar164);
                  fVar8 = auVar190._0_4_ * fVar52;
                  auVar190 = vandps_avx(ZEXT416((uint)fVar8),auVar54);
                  auVar190 = vorps_avx(auVar190,auVar64);
                  auVar190 = ZEXT416((uint)(fVar8 + auVar190._0_4_));
                  auVar190 = vroundss_avx(auVar190,auVar190,0xb);
                  iVar32 = (int)auVar190._0_4_;
                  if (iVar32 < -0x7e) {
                    iVar32 = -0x7f;
                  }
                  if (0x7e < iVar32) {
                    iVar32 = 0x7f;
                  }
                  *(char *)((long)pvVar50 + lVar31) = (char)iVar32;
                  lVar31 = lVar31 + 1;
                }
                puVar44 = (undefined4 *)((long)puVar44 + lVar31 + 2);
                lVar33 = lVar33 + lVar31 + 2;
                lVar20 = lVar20 + lVar31 + 2;
                pvVar50 = (void *)((long)pvVar50 + lVar31);
              }
            }
            this_00 = &local_90;
          }
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          pLVar7 = this->activation;
          if (pLVar7 != (Layer *)0x0) {
            (*pLVar7->_vptr_Layer[9])(pLVar7,top_blob,opt);
          }
        }
        else if (iVar32 == 8) {
          uVar47 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                   (long)(this->super_ConvolutionDepthWise).kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,uVar47,
                     (allocator_type *)&top_rescale);
          iVar28 = (this->super_ConvolutionDepthWise).dilation_h;
          iVar41 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar32 = (this->super_ConvolutionDepthWise).dilation_w * iVar41;
          iVar29 = 0;
          lVar33 = 0;
          for (iVar22 = 0; iVar22 < (this->super_ConvolutionDepthWise).kernel_h; iVar22 = iVar22 + 1
              ) {
            for (lVar35 = 0; (int)lVar35 < iVar41; lVar35 = lVar35 + 1) {
              *(int *)(opt_q._0_8_ + (long)(int)lVar33 * 4 + lVar35 * 4) = iVar29;
              iVar29 = iVar29 + (this->super_ConvolutionDepthWise).dilation_w;
              iVar41 = (this->super_ConvolutionDepthWise).kernel_w;
            }
            iVar29 = iVar29 + (iVar48 * iVar28 - iVar32);
            lVar33 = (int)lVar33 + lVar35;
          }
          iVar28 = 0;
          uVar49 = uVar47 & 0xffffffff;
          if ((int)uVar47 < 1) {
            uVar49 = 0;
          }
          if ((int)uVar46 < 1) {
            uVar46 = 0;
          }
          for (uVar34 = 0; uVar34 != uVar46; uVar34 = uVar34 + 1) {
            pauVar36 = (undefined1 (*) [16])
                       (top_blob->elemsize * uVar34 * top_blob->cstep + (long)top_blob->data);
            pvVar4 = (this->weight_data_tm).data;
            pauVar37 = pauVar36;
            for (iVar41 = 0; iVar41 <= iVar45; iVar41 = iVar41 + 1) {
              for (iVar32 = 0; iVar32 <= iVar25; iVar32 = iVar32 + 1) {
                auVar92 = ZEXT1664((undefined1  [16])0x0);
                uVar42 = 0;
                auVar100 = ZEXT1664((undefined1  [16])0x0);
                while( true ) {
                  if (uVar49 == uVar42) break;
                  auVar101._8_8_ = 0;
                  auVar101._0_8_ =
                       *(ulong *)((long)local_2d8.data +
                                 (long)*(int *)(opt_q._0_8_ + uVar42 * 4) * 8 +
                                 (long)iVar41 * (long)(this->super_ConvolutionDepthWise).stride_h *
                                 (long)local_2d8.w * local_2d8.elemsize +
                                 (long)((this->super_ConvolutionDepthWise).stride_w * iVar32 * 8) +
                                 local_2d8.cstep * uVar34 * local_2d8.elemsize);
                  auVar164 = vpcmpgtb_avx((undefined1  [16])0x0,auVar101);
                  auVar175 = vpunpcklbw_avx(auVar101,auVar164);
                  auVar160._8_8_ = 0;
                  auVar160._0_8_ = *(ulong *)((long)pvVar4 + uVar42 * 8 + (long)iVar28);
                  auVar164 = vpcmpgtb_avx((undefined1  [16])0x0,auVar160);
                  auVar164 = vpunpcklbw_avx(auVar160,auVar164);
                  auVar190 = vpmullw_avx(auVar164,auVar175);
                  auVar164 = vpmulhw_avx(auVar164,auVar175);
                  auVar175 = vpunpcklwd_avx(auVar190,auVar164);
                  auVar190 = vpunpckhwd_avx(auVar190,auVar164);
                  auVar164 = vpaddd_avx(auVar175,auVar100._0_16_);
                  auVar100 = ZEXT1664(auVar164);
                  auVar164 = vpaddd_avx(auVar92._0_16_,auVar190);
                  auVar92 = ZEXT1664(auVar164);
                  uVar42 = uVar42 + 1;
                }
                pvVar5 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                pvVar50 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                auVar164 = *(undefined1 (*) [16])((long)pvVar5 + uVar34 * 0x20);
                auVar190 = *(undefined1 (*) [16])((long)pvVar5 + uVar34 * 0x20 + 0x10);
                pfVar38 = (float *)((long)pvVar50 + uVar34 * 0x20);
                auVar172._0_4_ = auVar164._0_4_ * *pfVar38;
                auVar172._4_4_ = auVar164._4_4_ * pfVar38[1];
                auVar172._8_4_ = auVar164._8_4_ * pfVar38[2];
                auVar172._12_4_ = auVar164._12_4_ * pfVar38[3];
                pfVar38 = (float *)((long)pvVar50 + uVar34 * 0x20 + 0x10);
                auVar182._0_4_ = auVar190._0_4_ * *pfVar38;
                auVar182._4_4_ = auVar190._4_4_ * pfVar38[1];
                auVar182._8_4_ = auVar190._8_4_ * pfVar38[2];
                auVar182._12_4_ = auVar190._12_4_ * pfVar38[3];
                auVar175 = vrcpps_avx(auVar172);
                auVar62 = vrcpps_avx(auVar182);
                auVar164 = vcmpps_avx(auVar164,(undefined1  [16])0x0,4);
                auVar164 = vandps_avx(auVar175,auVar164);
                auVar190 = vcmpps_avx(auVar190,(undefined1  [16])0x0,4);
                auVar190 = vandps_avx(auVar190,auVar62);
                auVar175 = vcvtdq2ps_avx(auVar100._0_16_);
                auVar93._0_4_ = auVar164._0_4_ * auVar175._0_4_;
                auVar93._4_4_ = auVar164._4_4_ * auVar175._4_4_;
                auVar93._8_4_ = auVar164._8_4_ * auVar175._8_4_;
                auVar93._12_4_ = auVar164._12_4_ * auVar175._12_4_;
                auVar164 = vcvtdq2ps_avx(auVar92._0_16_);
                auVar86._0_4_ = auVar190._0_4_ * auVar164._0_4_;
                auVar86._4_4_ = auVar190._4_4_ * auVar164._4_4_;
                auVar86._8_4_ = auVar190._8_4_ * auVar164._8_4_;
                auVar86._12_4_ = auVar190._12_4_ * auVar164._12_4_;
                if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                  pvVar5 = (this->super_ConvolutionDepthWise).bias_data.data;
                  pfVar38 = (float *)((long)pvVar5 + uVar34 * 0x20);
                  auVar93._0_4_ = auVar93._0_4_ + *pfVar38;
                  auVar93._4_4_ = auVar93._4_4_ + pfVar38[1];
                  auVar93._8_4_ = auVar93._8_4_ + pfVar38[2];
                  auVar93._12_4_ = auVar93._12_4_ + pfVar38[3];
                  pfVar38 = (float *)((long)pvVar5 + uVar34 * 0x20 + 0x10);
                  auVar86._0_4_ = auVar86._0_4_ + *pfVar38;
                  auVar86._4_4_ = auVar86._4_4_ + pfVar38[1];
                  auVar86._8_4_ = auVar86._8_4_ + pfVar38[2];
                  auVar86._12_4_ = auVar86._12_4_ + pfVar38[3];
                }
                iVar22 = (this->super_ConvolutionDepthWise).activation_type;
                auVar108 = auVar93;
                auVar181 = auVar86;
                if (iVar22 - 1U < 6) {
                  auVar108 = vmaxps_avx(auVar93,(undefined1  [16])0x0);
                  auVar181 = vmaxps_avx(auVar86,(undefined1  [16])0x0);
                  switch(iVar22) {
                  case 2:
                    auVar164 = vminps_avx(auVar93,(undefined1  [16])0x0);
                    uVar30 = *(this->super_ConvolutionDepthWise).activation_params.data;
                    auVar161._4_4_ = uVar30;
                    auVar161._0_4_ = uVar30;
                    auVar161._8_4_ = uVar30;
                    auVar161._12_4_ = uVar30;
                    auVar108 = vfmadd231ps_fma(auVar108,auVar161,auVar164);
                    auVar164 = vminps_avx(auVar86,(undefined1  [16])0x0);
                    auVar181 = vfmadd231ps_fma(auVar181,auVar161,auVar164);
                    break;
                  case 3:
                    puVar44 = (undefined4 *)
                              (this->super_ConvolutionDepthWise).activation_params.data;
                    uVar30 = *puVar44;
                    auVar170._4_4_ = uVar30;
                    auVar170._0_4_ = uVar30;
                    auVar170._8_4_ = uVar30;
                    auVar170._12_4_ = uVar30;
                    uVar30 = puVar44[1];
                    auVar177._4_4_ = uVar30;
                    auVar177._0_4_ = uVar30;
                    auVar177._8_4_ = uVar30;
                    auVar177._12_4_ = uVar30;
                    auVar164 = vmaxps_avx(auVar170,auVar93);
                    auVar108 = vminps_avx(auVar177,auVar164);
                    auVar164 = vmaxps_avx(auVar170,auVar86);
                    auVar181 = vminps_avx(auVar177,auVar164);
                    break;
                  case 4:
                    auVar95._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
                    auVar95._8_4_ = -auVar93._8_4_;
                    auVar95._12_4_ = -auVar93._12_4_;
                    auVar159._8_4_ = 0x42b0c0a5;
                    auVar159._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar159._12_4_ = 0x42b0c0a5;
                    auVar164 = vminps_avx(auVar159,auVar95);
                    auVar145._8_4_ = 0xc2b0c0a5;
                    auVar145._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar145._12_4_ = 0xc2b0c0a5;
                    auVar175 = vmaxps_avx(auVar145,auVar164);
                    auVar96._8_4_ = 0x3fb8aa3b;
                    auVar96._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar96._12_4_ = 0x3fb8aa3b;
                    auVar58._8_4_ = 0x3f000000;
                    auVar58._0_8_ = 0x3f0000003f000000;
                    auVar58._12_4_ = 0x3f000000;
                    auVar164 = vfmadd213ps_fma(auVar96,auVar175,auVar58);
                    auVar106._0_4_ = (int)auVar164._0_4_;
                    auVar106._4_4_ = (int)auVar164._4_4_;
                    auVar106._8_4_ = (int)auVar164._8_4_;
                    auVar106._12_4_ = (int)auVar164._12_4_;
                    auVar190 = vcvtdq2ps_avx(auVar106);
                    auVar164 = vcmpps_avx(auVar164,auVar190,1);
                    auVar80._8_4_ = 0x3f800000;
                    auVar80._0_8_ = 0x3f8000003f800000;
                    auVar80._12_4_ = 0x3f800000;
                    auVar164 = vandps_avx(auVar164,auVar80);
                    auVar62 = vsubps_avx(auVar190,auVar164);
                    auVar141._8_4_ = 0x3f318000;
                    auVar141._0_8_ = 0x3f3180003f318000;
                    auVar141._12_4_ = 0x3f318000;
                    auVar164 = vfmsub231ps_fma(auVar175,auVar62,auVar141);
                    auVar192._8_4_ = 0xb95e8083;
                    auVar192._0_8_ = 0xb95e8083b95e8083;
                    auVar192._12_4_ = 0xb95e8083;
                    auVar190 = vfnmsub231ps_fma(auVar164,auVar62,auVar192);
                    auVar178._0_4_ = auVar190._0_4_ * auVar190._0_4_;
                    auVar178._4_4_ = auVar190._4_4_ * auVar190._4_4_;
                    auVar178._8_4_ = auVar190._8_4_ * auVar190._8_4_;
                    auVar178._12_4_ = auVar190._12_4_ * auVar190._12_4_;
                    auVar157._8_4_ = 0x39506967;
                    auVar157._0_8_ = 0x3950696739506967;
                    auVar157._12_4_ = 0x39506967;
                    auVar195._8_4_ = 0x3ab743ce;
                    auVar195._0_8_ = 0x3ab743ce3ab743ce;
                    auVar195._12_4_ = 0x3ab743ce;
                    auVar164 = vfmadd213ps_fma(auVar157,auVar190,auVar195);
                    auVar198._8_4_ = 0x3c088908;
                    auVar198._0_8_ = 0x3c0889083c088908;
                    auVar198._12_4_ = 0x3c088908;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar190,auVar198);
                    auVar129._8_4_ = 0x3d2aa9c1;
                    auVar129._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar129._12_4_ = 0x3d2aa9c1;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar190,auVar129);
                    auVar130._8_4_ = 0x3e2aaaaa;
                    auVar130._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar130._12_4_ = 0x3e2aaaaa;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar190,auVar130);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar190,auVar58);
                    auVar81 = vfmadd213ps_fma(auVar164,auVar178,auVar190);
                    auVar87._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                    auVar87._8_4_ = -auVar86._8_4_;
                    auVar87._12_4_ = -auVar86._12_4_;
                    auVar164 = vminps_avx(auVar159,auVar87);
                    auVar175 = vmaxps_avx(auVar145,auVar164);
                    auVar171._8_4_ = 0x3fb8aa3b;
                    auVar171._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar171._12_4_ = 0x3fb8aa3b;
                    auVar164 = vfmadd213ps_fma(auVar171,auVar175,auVar58);
                    auVar179._0_4_ = (int)auVar164._0_4_;
                    auVar179._4_4_ = (int)auVar164._4_4_;
                    auVar179._8_4_ = (int)auVar164._8_4_;
                    auVar179._12_4_ = (int)auVar164._12_4_;
                    auVar190 = vcvtdq2ps_avx(auVar179);
                    auVar164 = vcmpps_avx(auVar164,auVar190,1);
                    auVar164 = vandps_avx(auVar164,auVar80);
                    auVar190 = vsubps_avx(auVar190,auVar164);
                    auVar164 = vfmsub231ps_fma(auVar175,auVar190,auVar141);
                    auVar175 = vfnmsub231ps_fma(auVar164,auVar190,auVar192);
                    auVar180._0_4_ = auVar175._0_4_ * auVar175._0_4_;
                    auVar180._4_4_ = auVar175._4_4_ * auVar175._4_4_;
                    auVar180._8_4_ = auVar175._8_4_ * auVar175._8_4_;
                    auVar180._12_4_ = auVar175._12_4_ * auVar175._12_4_;
                    auVar164 = vfmadd213ps_fma(auVar157,auVar175,auVar195);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar175,auVar198);
                    auVar142._8_4_ = 0x3d2aa9c1;
                    auVar142._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar142._12_4_ = 0x3d2aa9c1;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar175,auVar142);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar175,auVar130);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar175,auVar58);
                    auVar175 = vfmadd213ps_fma(auVar164,auVar180,auVar175);
                    auVar88._0_4_ = auVar81._0_4_ + 1.0;
                    auVar88._4_4_ = auVar81._4_4_ + 1.0;
                    auVar88._8_4_ = auVar81._8_4_ + 1.0;
                    auVar88._12_4_ = auVar81._12_4_ + 1.0;
                    auVar97._0_4_ = (int)auVar62._0_4_;
                    auVar97._4_4_ = (int)auVar62._4_4_;
                    auVar97._8_4_ = (int)auVar62._8_4_;
                    auVar97._12_4_ = (int)auVar62._12_4_;
                    auVar164 = vpslld_avx(auVar97,0x17);
                    auVar164 = vpaddd_avx(auVar164,auVar80);
                    auVar62 = vfmadd213ps_fma(auVar164,auVar88,auVar80);
                    auVar89._0_4_ = auVar175._0_4_ + 1.0;
                    auVar89._4_4_ = auVar175._4_4_ + 1.0;
                    auVar89._8_4_ = auVar175._8_4_ + 1.0;
                    auVar89._12_4_ = auVar175._12_4_ + 1.0;
                    auVar107._0_4_ = (int)auVar190._0_4_;
                    auVar107._4_4_ = (int)auVar190._4_4_;
                    auVar107._8_4_ = (int)auVar190._8_4_;
                    auVar107._12_4_ = (int)auVar190._12_4_;
                    auVar164 = vpslld_avx(auVar107,0x17);
                    auVar164 = vpaddd_avx(auVar164,auVar80);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar89,auVar80);
                    auVar108 = vdivps_avx(auVar80,auVar62);
                    auVar181 = vdivps_avx(auVar80,auVar164);
                    break;
                  case 5:
                    auVar56._8_4_ = 0x42b0c0a5;
                    auVar56._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar56._12_4_ = 0x42b0c0a5;
                    auVar164 = vminps_avx(auVar93,auVar56);
                    auVar196._8_4_ = 0xc2b0c0a5;
                    auVar196._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar196._12_4_ = 0xc2b0c0a5;
                    auVar175 = vmaxps_avx(auVar196,auVar164);
                    auVar162._8_4_ = 0x3fb8aa3b;
                    auVar162._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar162._12_4_ = 0x3fb8aa3b;
                    auVar144._8_4_ = 0x3f000000;
                    auVar144._0_8_ = 0x3f0000003f000000;
                    auVar144._12_4_ = 0x3f000000;
                    auVar164 = vfmadd213ps_fma(auVar162,auVar175,auVar144);
                    auVar173._0_4_ = (int)auVar164._0_4_;
                    auVar173._4_4_ = (int)auVar164._4_4_;
                    auVar173._8_4_ = (int)auVar164._8_4_;
                    auVar173._12_4_ = (int)auVar164._12_4_;
                    auVar190 = vcvtdq2ps_avx(auVar173);
                    auVar164 = vcmpps_avx(auVar164,auVar190,1);
                    auVar57._8_4_ = 0x3f800000;
                    auVar57._0_8_ = 0x3f8000003f800000;
                    auVar57._12_4_ = 0x3f800000;
                    auVar164 = vandps_avx(auVar164,auVar57);
                    auVar164 = vsubps_avx(auVar190,auVar164);
                    auVar111._8_4_ = 0x3f318000;
                    auVar111._0_8_ = 0x3f3180003f318000;
                    auVar111._12_4_ = 0x3f318000;
                    auVar190 = vfmsub231ps_fma(auVar175,auVar164,auVar111);
                    auVar112._8_4_ = 0xb95e8083;
                    auVar112._0_8_ = 0xb95e8083b95e8083;
                    auVar112._12_4_ = 0xb95e8083;
                    auVar175 = vfnmsub231ps_fma(auVar190,auVar164,auVar112);
                    auVar174._0_4_ = auVar175._0_4_ * auVar175._0_4_;
                    auVar174._4_4_ = auVar175._4_4_ * auVar175._4_4_;
                    auVar174._8_4_ = auVar175._8_4_ * auVar175._8_4_;
                    auVar174._12_4_ = auVar175._12_4_ * auVar175._12_4_;
                    auVar183._8_4_ = 0x39506967;
                    auVar183._0_8_ = 0x3950696739506967;
                    auVar183._12_4_ = 0x39506967;
                    auVar113._8_4_ = 0x3ab743ce;
                    auVar113._0_8_ = 0x3ab743ce3ab743ce;
                    auVar113._12_4_ = 0x3ab743ce;
                    auVar190 = vfmadd213ps_fma(auVar183,auVar175,auVar113);
                    auVar146._8_4_ = 0x3c088908;
                    auVar146._0_8_ = 0x3c0889083c088908;
                    auVar146._12_4_ = 0x3c088908;
                    auVar190 = vfmadd213ps_fma(auVar190,auVar175,auVar146);
                    auVar158._8_4_ = 0x3d2aa9c1;
                    auVar158._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar158._12_4_ = 0x3d2aa9c1;
                    auVar190 = vfmadd213ps_fma(auVar190,auVar175,auVar158);
                    auVar114._8_4_ = 0x3e2aaaaa;
                    auVar114._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar114._12_4_ = 0x3e2aaaaa;
                    auVar190 = vfmadd213ps_fma(auVar190,auVar175,auVar114);
                    auVar190 = vfmadd213ps_fma(auVar190,auVar175,auVar144);
                    auVar190 = vfmadd213ps_fma(auVar190,auVar174,auVar175);
                    auVar102._0_4_ = auVar190._0_4_ + 1.0;
                    auVar102._4_4_ = auVar190._4_4_ + 1.0;
                    auVar102._8_4_ = auVar190._8_4_ + 1.0;
                    auVar102._12_4_ = auVar190._12_4_ + 1.0;
                    auVar163._0_4_ = (int)auVar164._0_4_;
                    auVar163._4_4_ = (int)auVar164._4_4_;
                    auVar163._8_4_ = (int)auVar164._8_4_;
                    auVar163._12_4_ = (int)auVar164._12_4_;
                    auVar164 = vpslld_avx(auVar163,0x17);
                    auVar164 = vpaddd_avx(auVar164,auVar57);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar102,auVar57);
                    auVar190 = vcmpps_avx(auVar164,(undefined1  [16])0x0,2);
                    auVar115._8_4_ = 0x800000;
                    auVar115._0_8_ = 0x80000000800000;
                    auVar115._12_4_ = 0x800000;
                    auVar164 = vmaxps_avx(auVar164,auVar115);
                    auVar175 = vpsrld_avx(auVar164,0x17);
                    auVar132._8_4_ = 0x807fffff;
                    auVar132._0_8_ = 0x807fffff807fffff;
                    auVar132._12_4_ = 0x807fffff;
                    auVar164 = vandps_avx(auVar164,auVar132);
                    auVar81 = vorps_avx(auVar164,auVar144);
                    auVar133._8_4_ = 0xffffff82;
                    auVar133._0_8_ = 0xffffff82ffffff82;
                    auVar133._12_4_ = 0xffffff82;
                    auVar164 = vpaddd_avx(auVar175,auVar133);
                    auVar62 = vcvtdq2ps_avx(auVar164);
                    auVar134._8_4_ = 0x3f3504f3;
                    auVar134._0_8_ = 0x3f3504f33f3504f3;
                    auVar134._12_4_ = 0x3f3504f3;
                    auVar175 = vcmpps_avx(auVar81,auVar134,1);
                    auVar164 = vandps_avx(auVar175,auVar81);
                    auVar135._0_4_ = auVar81._0_4_ + -1.0 + auVar164._0_4_;
                    auVar135._4_4_ = auVar81._4_4_ + -1.0 + auVar164._4_4_;
                    auVar135._8_4_ = auVar81._8_4_ + -1.0 + auVar164._8_4_;
                    auVar135._12_4_ = auVar81._12_4_ + -1.0 + auVar164._12_4_;
                    auVar164 = vandps_avx(auVar175,auVar57);
                    auVar164 = vsubps_avx(auVar62,auVar164);
                    auVar176._0_4_ = auVar135._0_4_ * auVar135._0_4_;
                    auVar176._4_4_ = auVar135._4_4_ * auVar135._4_4_;
                    auVar176._8_4_ = auVar135._8_4_ * auVar135._8_4_;
                    auVar176._12_4_ = auVar135._12_4_ * auVar135._12_4_;
                    auVar184._8_4_ = 0x3d9021bb;
                    auVar184._0_8_ = 0x3d9021bb3d9021bb;
                    auVar184._12_4_ = 0x3d9021bb;
                    auVar147._8_4_ = 0xbdebd1b8;
                    auVar147._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar147._12_4_ = 0xbdebd1b8;
                    auVar175 = vfmadd213ps_fma(auVar184,auVar135,auVar147);
                    auVar148._8_4_ = 0x3def251a;
                    auVar148._0_8_ = 0x3def251a3def251a;
                    auVar148._12_4_ = 0x3def251a;
                    auVar175 = vfmadd213ps_fma(auVar175,auVar135,auVar148);
                    auVar149._8_4_ = 0xbdfe5d4f;
                    auVar149._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar149._12_4_ = 0xbdfe5d4f;
                    auVar175 = vfmadd213ps_fma(auVar175,auVar135,auVar149);
                    auVar150._8_4_ = 0x3e11e9bf;
                    auVar150._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar150._12_4_ = 0x3e11e9bf;
                    auVar175 = vfmadd213ps_fma(auVar175,auVar135,auVar150);
                    auVar151._8_4_ = 0xbe2aae50;
                    auVar151._0_8_ = 0xbe2aae50be2aae50;
                    auVar151._12_4_ = 0xbe2aae50;
                    auVar175 = vfmadd213ps_fma(auVar175,auVar135,auVar151);
                    auVar152._8_4_ = 0x3e4cceac;
                    auVar152._0_8_ = 0x3e4cceac3e4cceac;
                    auVar152._12_4_ = 0x3e4cceac;
                    auVar175 = vfmadd213ps_fma(auVar175,auVar135,auVar152);
                    auVar153._8_4_ = 0xbe7ffffc;
                    auVar153._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar153._12_4_ = 0xbe7ffffc;
                    auVar175 = vfmadd213ps_fma(auVar175,auVar135,auVar153);
                    auVar154._8_4_ = 0x3eaaaaaa;
                    auVar154._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar154._12_4_ = 0x3eaaaaaa;
                    auVar175 = vfmadd213ps_fma(auVar175,auVar135,auVar154);
                    auVar185._0_4_ = auVar176._0_4_ * auVar135._0_4_ * auVar175._0_4_;
                    auVar185._4_4_ = auVar176._4_4_ * auVar135._4_4_ * auVar175._4_4_;
                    auVar185._8_4_ = auVar176._8_4_ * auVar135._8_4_ * auVar175._8_4_;
                    auVar185._12_4_ = auVar176._12_4_ * auVar135._12_4_ * auVar175._12_4_;
                    auVar193._8_4_ = 0xb95e8083;
                    auVar193._0_8_ = 0xb95e8083b95e8083;
                    auVar193._12_4_ = 0xb95e8083;
                    auVar175 = vfmadd231ps_fma(auVar185,auVar164,auVar193);
                    auVar175 = vfmsub231ps_fma(auVar175,auVar144,auVar176);
                    auVar175 = vsubps_avx(auVar175,auVar135);
                    auVar164 = vfmsub231ps_fma(auVar175,auVar111,auVar164);
                    auVar136._0_4_ = auVar164._0_4_ * -2.0;
                    auVar136._4_4_ = auVar164._4_4_ * -2.0;
                    auVar136._8_4_ = auVar164._8_4_ * -2.0;
                    auVar136._12_4_ = auVar164._12_4_ * -2.0;
                    auVar67._8_4_ = 0x7fffffff;
                    auVar67._0_8_ = 0x7fffffff7fffffff;
                    auVar67._12_4_ = 0x7fffffff;
                    auVar164 = vblendvps_avx(auVar136,auVar67,auVar190);
                    auVar68._8_4_ = 0x42b0c0a5;
                    auVar68._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar68._12_4_ = 0x42b0c0a5;
                    auVar164 = vminps_avx(auVar164,auVar68);
                    auVar175 = vmaxps_avx(auVar196,auVar164);
                    auVar186._8_4_ = 0x3fb8aa3b;
                    auVar186._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar186._12_4_ = 0x3fb8aa3b;
                    auVar164 = vfmadd213ps_fma(auVar186,auVar175,auVar144);
                    auVar165._0_4_ = (int)auVar164._0_4_;
                    auVar165._4_4_ = (int)auVar164._4_4_;
                    auVar165._8_4_ = (int)auVar164._8_4_;
                    auVar165._12_4_ = (int)auVar164._12_4_;
                    auVar190 = vcvtdq2ps_avx(auVar165);
                    auVar164 = vcmpps_avx(auVar164,auVar190,1);
                    auVar164 = vandps_avx(auVar164,auVar57);
                    auVar81 = vsubps_avx(auVar190,auVar164);
                    auVar164 = vfmsub231ps_fma(auVar175,auVar81,auVar111);
                    auVar190 = vfnmsub231ps_fma(auVar164,auVar81,auVar193);
                    auVar166._0_4_ = auVar190._0_4_ * auVar190._0_4_;
                    auVar166._4_4_ = auVar190._4_4_ * auVar190._4_4_;
                    auVar166._8_4_ = auVar190._8_4_ * auVar190._8_4_;
                    auVar166._12_4_ = auVar190._12_4_ * auVar190._12_4_;
                    auVar103._8_4_ = 0x39506967;
                    auVar103._0_8_ = 0x3950696739506967;
                    auVar103._12_4_ = 0x39506967;
                    auVar69._8_4_ = 0x3ab743ce;
                    auVar69._0_8_ = 0x3ab743ce3ab743ce;
                    auVar69._12_4_ = 0x3ab743ce;
                    auVar164 = vfmadd213ps_fma(auVar103,auVar190,auVar69);
                    auVar116._8_4_ = 0x3c088908;
                    auVar116._0_8_ = 0x3c0889083c088908;
                    auVar116._12_4_ = 0x3c088908;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar190,auVar116);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar190,auVar158);
                    auVar155._8_4_ = 0x3e2aaaaa;
                    auVar155._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar155._12_4_ = 0x3e2aaaaa;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar190,auVar155);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar190,auVar144);
                    auVar82 = vfmadd213ps_fma(auVar164,auVar166,auVar190);
                    auVar137._8_4_ = 0x42b0c0a5;
                    auVar137._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar137._12_4_ = 0x42b0c0a5;
                    auVar164 = vminps_avx(auVar86,auVar137);
                    auVar175 = vmaxps_avx(auVar196,auVar164);
                    auVar164 = vfmadd213ps_fma(auVar186,auVar175,auVar144);
                    auVar187._0_4_ = (int)auVar164._0_4_;
                    auVar187._4_4_ = (int)auVar164._4_4_;
                    auVar187._8_4_ = (int)auVar164._8_4_;
                    auVar187._12_4_ = (int)auVar164._12_4_;
                    auVar190 = vcvtdq2ps_avx(auVar187);
                    auVar164 = vcmpps_avx(auVar164,auVar190,1);
                    auVar164 = vandps_avx(auVar164,auVar57);
                    auVar164 = vsubps_avx(auVar190,auVar164);
                    auVar188._8_4_ = 0x3f318000;
                    auVar188._0_8_ = 0x3f3180003f318000;
                    auVar188._12_4_ = 0x3f318000;
                    auVar190 = vfmsub231ps_fma(auVar175,auVar164,auVar188);
                    auVar175 = vfnmsub231ps_fma(auVar190,auVar164,auVar193);
                    auVar189._0_4_ = auVar175._0_4_ * auVar175._0_4_;
                    auVar189._4_4_ = auVar175._4_4_ * auVar175._4_4_;
                    auVar189._8_4_ = auVar175._8_4_ * auVar175._8_4_;
                    auVar189._12_4_ = auVar175._12_4_ * auVar175._12_4_;
                    auVar190 = vfmadd213ps_fma(auVar103,auVar175,auVar69);
                    auVar190 = vfmadd213ps_fma(auVar190,auVar175,auVar116);
                    auVar190 = vfmadd213ps_fma(auVar190,auVar175,auVar158);
                    auVar190 = vfmadd213ps_fma(auVar190,auVar175,auVar155);
                    auVar190 = vfmadd213ps_fma(auVar190,auVar175,auVar144);
                    auVar190 = vfmadd213ps_fma(auVar190,auVar189,auVar175);
                    auVar138._0_4_ = auVar190._0_4_ + 1.0;
                    auVar138._4_4_ = auVar190._4_4_ + 1.0;
                    auVar138._8_4_ = auVar190._8_4_ + 1.0;
                    auVar138._12_4_ = auVar190._12_4_ + 1.0;
                    auVar167._0_4_ = (int)auVar164._0_4_;
                    auVar167._4_4_ = (int)auVar164._4_4_;
                    auVar167._8_4_ = (int)auVar164._8_4_;
                    auVar167._12_4_ = (int)auVar164._12_4_;
                    auVar164 = vpslld_avx(auVar167,0x17);
                    auVar164 = vpaddd_avx(auVar164,auVar57);
                    auVar83 = vfmadd213ps_fma(auVar164,auVar138,auVar57);
                    auVar70._8_4_ = 0x800000;
                    auVar70._0_8_ = 0x80000000800000;
                    auVar70._12_4_ = 0x800000;
                    auVar164 = vmaxps_avx(auVar83,auVar70);
                    auVar190 = vpsrld_avx(auVar164,0x17);
                    auVar71._8_4_ = 0x807fffff;
                    auVar71._0_8_ = 0x807fffff807fffff;
                    auVar71._12_4_ = 0x807fffff;
                    auVar164 = vandps_avx(auVar164,auVar71);
                    auVar62 = vorps_avx(auVar144,auVar164);
                    auVar72._8_4_ = 0xffffff82;
                    auVar72._0_8_ = 0xffffff82ffffff82;
                    auVar72._12_4_ = 0xffffff82;
                    auVar164 = vpaddd_avx(auVar190,auVar72);
                    auVar175 = vcvtdq2ps_avx(auVar164);
                    auVar73._8_4_ = 0x3f3504f3;
                    auVar73._0_8_ = 0x3f3504f33f3504f3;
                    auVar73._12_4_ = 0x3f3504f3;
                    auVar190 = vcmpps_avx(auVar62,auVar73,1);
                    auVar164 = vandps_avx(auVar190,auVar62);
                    auVar139._0_4_ = auVar164._0_4_ + auVar62._0_4_ + -1.0;
                    auVar139._4_4_ = auVar164._4_4_ + auVar62._4_4_ + -1.0;
                    auVar139._8_4_ = auVar164._8_4_ + auVar62._8_4_ + -1.0;
                    auVar139._12_4_ = auVar164._12_4_ + auVar62._12_4_ + -1.0;
                    auVar164 = vandps_avx(auVar190,auVar57);
                    auVar190 = vsubps_avx(auVar175,auVar164);
                    auVar194._0_4_ = auVar139._0_4_ * auVar139._0_4_;
                    auVar194._4_4_ = auVar139._4_4_ * auVar139._4_4_;
                    auVar194._8_4_ = auVar139._8_4_ * auVar139._8_4_;
                    auVar194._12_4_ = auVar139._12_4_ * auVar139._12_4_;
                    auVar197._8_4_ = 0x3d9021bb;
                    auVar197._0_8_ = 0x3d9021bb3d9021bb;
                    auVar197._12_4_ = 0x3d9021bb;
                    auVar117._8_4_ = 0xbdebd1b8;
                    auVar117._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar117._12_4_ = 0xbdebd1b8;
                    auVar164 = vfmadd213ps_fma(auVar197,auVar139,auVar117);
                    auVar118._8_4_ = 0x3def251a;
                    auVar118._0_8_ = 0x3def251a3def251a;
                    auVar118._12_4_ = 0x3def251a;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar139,auVar118);
                    auVar119._8_4_ = 0xbdfe5d4f;
                    auVar119._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar119._12_4_ = 0xbdfe5d4f;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar139,auVar119);
                    auVar120._8_4_ = 0x3e11e9bf;
                    auVar120._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar120._12_4_ = 0x3e11e9bf;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar139,auVar120);
                    auVar121._8_4_ = 0xbe2aae50;
                    auVar121._0_8_ = 0xbe2aae50be2aae50;
                    auVar121._12_4_ = 0xbe2aae50;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar139,auVar121);
                    auVar122._8_4_ = 0x3e4cceac;
                    auVar122._0_8_ = 0x3e4cceac3e4cceac;
                    auVar122._12_4_ = 0x3e4cceac;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar139,auVar122);
                    auVar123._8_4_ = 0xbe7ffffc;
                    auVar123._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar123._12_4_ = 0xbe7ffffc;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar139,auVar123);
                    auVar124._8_4_ = 0x3eaaaaaa;
                    auVar124._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar124._12_4_ = 0x3eaaaaaa;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar139,auVar124);
                    auVar125._0_4_ = auVar164._0_4_ * auVar194._0_4_ * auVar139._0_4_;
                    auVar125._4_4_ = auVar164._4_4_ * auVar194._4_4_ * auVar139._4_4_;
                    auVar125._8_4_ = auVar164._8_4_ * auVar194._8_4_ * auVar139._8_4_;
                    auVar125._12_4_ = auVar164._12_4_ * auVar194._12_4_ * auVar139._12_4_;
                    auVar104._8_4_ = 0xb95e8083;
                    auVar104._0_8_ = 0xb95e8083b95e8083;
                    auVar104._12_4_ = 0xb95e8083;
                    auVar164 = vfmadd231ps_fma(auVar125,auVar190,auVar104);
                    auVar175 = vfmsub231ps_fma(auVar164,auVar144,auVar194);
                    auVar164 = vcmpps_avx(auVar83,(undefined1  [16])0x0,2);
                    auVar175 = vsubps_avx(auVar175,auVar139);
                    auVar156._8_4_ = 0x3f318000;
                    auVar156._0_8_ = 0x3f3180003f318000;
                    auVar156._12_4_ = 0x3f318000;
                    auVar190 = vfmsub231ps_fma(auVar175,auVar156,auVar190);
                    auVar126._0_4_ = auVar190._0_4_ * -2.0;
                    auVar126._4_4_ = auVar190._4_4_ * -2.0;
                    auVar126._8_4_ = auVar190._8_4_ * -2.0;
                    auVar126._12_4_ = auVar190._12_4_ * -2.0;
                    auVar74._8_4_ = 0x7fffffff;
                    auVar74._0_8_ = 0x7fffffff7fffffff;
                    auVar74._12_4_ = 0x7fffffff;
                    auVar164 = vblendvps_avx(auVar126,auVar74,auVar164);
                    auVar75._8_4_ = 0x42b0c0a5;
                    auVar75._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar75._12_4_ = 0x42b0c0a5;
                    auVar164 = vminps_avx(auVar164,auVar75);
                    auVar175 = vmaxps_avx(auVar196,auVar164);
                    auVar140._8_4_ = 0x3fb8aa3b;
                    auVar140._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar140._12_4_ = 0x3fb8aa3b;
                    auVar164 = vfmadd213ps_fma(auVar140,auVar175,auVar144);
                    auVar168._0_4_ = (int)auVar164._0_4_;
                    auVar168._4_4_ = (int)auVar164._4_4_;
                    auVar168._8_4_ = (int)auVar164._8_4_;
                    auVar168._12_4_ = (int)auVar164._12_4_;
                    auVar190 = vcvtdq2ps_avx(auVar168);
                    auVar164 = vcmpps_avx(auVar164,auVar190,1);
                    auVar164 = vandps_avx(auVar164,auVar57);
                    auVar190 = vsubps_avx(auVar190,auVar164);
                    auVar164 = vfmsub231ps_fma(auVar175,auVar190,auVar156);
                    auVar175 = vfnmsub231ps_fma(auVar164,auVar190,auVar104);
                    auVar169._0_4_ = auVar175._0_4_ * auVar175._0_4_;
                    auVar169._4_4_ = auVar175._4_4_ * auVar175._4_4_;
                    auVar169._8_4_ = auVar175._8_4_ * auVar175._8_4_;
                    auVar169._12_4_ = auVar175._12_4_ * auVar175._12_4_;
                    auVar191._8_4_ = 0x39506967;
                    auVar191._0_8_ = 0x3950696739506967;
                    auVar191._12_4_ = 0x39506967;
                    auVar76._8_4_ = 0x3ab743ce;
                    auVar76._0_8_ = 0x3ab743ce3ab743ce;
                    auVar76._12_4_ = 0x3ab743ce;
                    auVar164 = vfmadd213ps_fma(auVar191,auVar175,auVar76);
                    auVar77._8_4_ = 0x3c088908;
                    auVar77._0_8_ = 0x3c0889083c088908;
                    auVar77._12_4_ = 0x3c088908;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar175,auVar77);
                    auVar78._8_4_ = 0x3d2aa9c1;
                    auVar78._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar78._12_4_ = 0x3d2aa9c1;
                    auVar164 = vfmadd213ps_fma(auVar164,auVar175,auVar78);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar175,auVar155);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar175,auVar144);
                    auVar175 = vfmadd213ps_fma(auVar164,auVar169,auVar175);
                    auVar127._0_4_ = auVar82._0_4_ + 1.0;
                    auVar127._4_4_ = auVar82._4_4_ + 1.0;
                    auVar127._8_4_ = auVar82._8_4_ + 1.0;
                    auVar127._12_4_ = auVar82._12_4_ + 1.0;
                    local_308 = auVar81._0_4_;
                    fStack_304 = auVar81._4_4_;
                    fStack_300 = auVar81._8_4_;
                    fStack_2fc = auVar81._12_4_;
                    auVar105._0_4_ = (int)local_308;
                    auVar105._4_4_ = (int)fStack_304;
                    auVar105._8_4_ = (int)fStack_300;
                    auVar105._12_4_ = (int)fStack_2fc;
                    auVar164 = vpslld_avx(auVar105,0x17);
                    auVar164 = vpaddd_avx(auVar164,auVar57);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar127,auVar57);
                    auVar79._8_4_ = 0x40000000;
                    auVar79._0_8_ = 0x4000000040000000;
                    auVar79._12_4_ = 0x40000000;
                    auVar164 = vdivps_avx(auVar79,auVar164);
                    auVar108 = vfmsub213ps_fma(auVar164,auVar93,auVar93);
                    auVar94._0_4_ = auVar175._0_4_ + 1.0;
                    auVar94._4_4_ = auVar175._4_4_ + 1.0;
                    auVar94._8_4_ = auVar175._8_4_ + 1.0;
                    auVar94._12_4_ = auVar175._12_4_ + 1.0;
                    auVar128._0_4_ = (int)auVar190._0_4_;
                    auVar128._4_4_ = (int)auVar190._4_4_;
                    auVar128._8_4_ = (int)auVar190._8_4_;
                    auVar128._12_4_ = (int)auVar190._12_4_;
                    auVar164 = vpslld_avx(auVar128,0x17);
                    auVar164 = vpaddd_avx(auVar164,auVar57);
                    auVar164 = vfmadd213ps_fma(auVar164,auVar94,auVar57);
                    auVar164 = vdivps_avx(auVar79,auVar164);
                    auVar181 = vfmsub213ps_fma(auVar164,auVar86,auVar86);
                    break;
                  case 6:
                    puVar44 = (undefined4 *)
                              (this->super_ConvolutionDepthWise).activation_params.data;
                    uVar30 = *puVar44;
                    auVar131._4_4_ = uVar30;
                    auVar131._0_4_ = uVar30;
                    auVar131._8_4_ = uVar30;
                    auVar131._12_4_ = uVar30;
                    uVar30 = puVar44[1];
                    auVar143._4_4_ = uVar30;
                    auVar143._0_4_ = uVar30;
                    auVar143._8_4_ = uVar30;
                    auVar143._12_4_ = uVar30;
                    auVar164 = vfmadd213ps_fma(auVar93,auVar131,auVar143);
                    auVar164 = vmaxps_avx(auVar164,(undefined1  [16])0x0);
                    auVar59._8_4_ = 0x3f800000;
                    auVar59._0_8_ = 0x3f8000003f800000;
                    auVar59._12_4_ = 0x3f800000;
                    auVar164 = vminps_avx(auVar164,auVar59);
                    auVar108._0_4_ = auVar164._0_4_ * auVar93._0_4_;
                    auVar108._4_4_ = auVar164._4_4_ * auVar93._4_4_;
                    auVar108._8_4_ = auVar164._8_4_ * auVar93._8_4_;
                    auVar108._12_4_ = auVar164._12_4_ * auVar93._12_4_;
                    auVar164 = vfmadd213ps_fma(auVar131,auVar86,auVar143);
                    auVar164 = vmaxps_avx(auVar164,(undefined1  [16])0x0);
                    auVar164 = vminps_avx(auVar164,auVar59);
                    auVar181._0_4_ = auVar164._0_4_ * auVar86._0_4_;
                    auVar181._4_4_ = auVar164._4_4_ * auVar86._4_4_;
                    auVar181._8_4_ = auVar164._8_4_ * auVar86._8_4_;
                    auVar181._12_4_ = auVar164._12_4_ * auVar86._12_4_;
                  }
                }
                if (iVar2 < 0x65) {
                  *pauVar37 = auVar108;
                  pauVar37[1] = auVar181;
                  pauVar37 = pauVar37 + 2;
                }
                else {
                  pvVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                  pfVar38 = (float *)((long)pvVar5 + uVar34 * 0x20);
                  auVar90._0_4_ = auVar108._0_4_ * *pfVar38;
                  auVar90._4_4_ = auVar108._4_4_ * pfVar38[1];
                  auVar90._8_4_ = auVar108._8_4_ * pfVar38[2];
                  auVar90._12_4_ = auVar108._12_4_ * pfVar38[3];
                  pfVar38 = (float *)((long)pvVar5 + uVar34 * 0x20 + 0x10);
                  auVar98._0_4_ = auVar181._0_4_ * *pfVar38;
                  auVar98._4_4_ = auVar181._4_4_ * pfVar38[1];
                  auVar98._8_4_ = auVar181._8_4_ * pfVar38[2];
                  auVar98._12_4_ = auVar181._12_4_ * pfVar38[3];
                  auVar60._8_4_ = 0x80000000;
                  auVar60._0_8_ = 0x8000000080000000;
                  auVar60._12_4_ = 0x80000000;
                  auVar164 = vandps_avx(auVar90,auVar60);
                  auVar190 = vandps_avx(auVar98,auVar60);
                  auVar61._8_4_ = 0x3f000000;
                  auVar61._0_8_ = 0x3f0000003f000000;
                  auVar61._12_4_ = 0x3f000000;
                  auVar164 = vorps_avx(auVar164,auVar61);
                  auVar190 = vorps_avx(auVar190,auVar61);
                  auVar91._0_4_ = (int)(auVar90._0_4_ + auVar164._0_4_);
                  auVar91._4_4_ = (int)(auVar90._4_4_ + auVar164._4_4_);
                  auVar91._8_4_ = (int)(auVar90._8_4_ + auVar164._8_4_);
                  auVar91._12_4_ = (int)(auVar90._12_4_ + auVar164._12_4_);
                  auVar99._0_4_ = (int)(auVar98._0_4_ + auVar190._0_4_);
                  auVar99._4_4_ = (int)(auVar98._4_4_ + auVar190._4_4_);
                  auVar99._8_4_ = (int)(auVar98._8_4_ + auVar190._8_4_);
                  auVar99._12_4_ = (int)(auVar98._12_4_ + auVar190._12_4_);
                  auVar164 = vpackssdw_avx(auVar91,auVar99);
                  auVar164 = vpminsw_avx(auVar164,_DAT_0054cd70);
                  auVar164 = vpmaxsw_avx(auVar164,_DAT_0054cd80);
                  auVar164 = vpacksswb_avx(auVar164,auVar164);
                  *(long *)*pauVar36 = auVar164._0_8_;
                  pauVar36 = (undefined1 (*) [16])((long)*pauVar36 + 8);
                }
              }
            }
            iVar28 = iVar28 + (int)uVar47 * 8;
          }
LAB_003b369b:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          iVar22 = 0;
        }
      }
    }
    else {
      uVar46 = (this->super_ConvolutionDepthWise).num_output;
      iVar25 = (this->super_ConvolutionDepthWise).int8_scale_term;
      if (opt->use_packing_layout == true) {
        if (iVar25 < 0x65) {
          uVar47 = (ulong)((uint)((uVar46 & 3) == 0) * 3 + 1);
        }
        else {
          uVar47 = 1;
          if ((uVar46 & 7) == 0) {
            uVar47 = 8;
          }
        }
      }
      else {
        uVar47 = 1;
      }
      uVar9 = (uint)uVar47;
      uVar49 = (ulong)(uVar9 * 4);
      if (100 < iVar25) {
        uVar49 = uVar47;
      }
      Mat::create(top_blob,iVar28,iVar41,(int)uVar46 / (int)uVar9,uVar49,uVar9,opt->blob_allocator);
      auVar17 = (undefined1  [32])opt_q._32_32_;
      sVar15 = local_2d8.cstep;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar45 = (this->super_ConvolutionDepthWise).group;
        uVar34 = (long)(int)uVar27 / (long)iVar45;
        uVar46 = (this->super_ConvolutionDepthWise).num_output / iVar45;
        if (opt->use_packing_layout == true) {
          uVar27 = 1;
          if ((uVar34 & 7) == 0) {
            uVar27 = _elempack_00;
          }
          if (iVar25 < 0x65) {
            _elempack = (uint)((uVar46 & 3) == 0) * 3 + 1;
          }
          else {
            _elempack = 1;
            if ((uVar46 & 7) == 0) {
              _elempack = _elempack_00;
            }
          }
        }
        else {
          uVar27 = 1;
          _elempack = uVar27;
        }
        piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
        opt_q.blob_allocator._4_4_ = local_2d8.refcount._4_4_;
        opt_q.blob_allocator._0_4_ = local_2d8.refcount._0_4_;
        opt_q._0_8_ = local_2d8.data;
        opt_q.workspace_allocator = (Allocator *)local_2d8.elemsize;
        opt_q.openmp_blocktime = local_2d8.elempack;
        opt_q.use_reserved_1 = (bool)(undefined1)local_2d8.w;
        opt_q.use_image_storage = (bool)local_2d8.w._1_1_;
        opt_q.use_tensor_storage = (bool)local_2d8.w._2_1_;
        opt_q.use_reserved_2 = (bool)local_2d8.w._3_1_;
        opt_q.vulkan_device_index = local_2d8.dims;
        opt_q.use_local_pool_allocator = (bool)(undefined1)local_2d8.d;
        opt_q.use_shader_local_memory = (bool)local_2d8.d._1_1_;
        opt_q.use_cooperative_matrix = (bool)local_2d8.d._2_1_;
        opt_q.use_winograd23_convolution = (bool)local_2d8.d._3_1_;
        opt_q.flush_denormals = local_2d8.h;
        opt_q._32_8_ = local_2d8.allocator;
        opt_q._60_4_ = auVar17._28_4_;
        opt_q.use_winograd43_convolution = (bool)(undefined1)local_2d8.c;
        opt_q.use_winograd63_convolution = (bool)local_2d8.c._1_1_;
        opt_q.use_a53_a55_optimized_kernel = (bool)local_2d8.c._2_1_;
        opt_q.use_fp16_uniform = (bool)local_2d8.c._3_1_;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        local_350 = uVar34 & 0xffffffff;
        uVar42 = uVar34;
        if ((int)uVar27 < iVar32) {
          _top_rescale = *(void **)opt;
          pAStack_228 = opt->workspace_allocator;
          iStack_220 = opt->openmp_blocktime;
          unique0x1000334f = opt->use_winograd_convolution;
          unique0x10003350 = opt->use_sgemm_convolution;
          unique0x10003351 = opt->use_int8_inference;
          unique0x10003352 = opt->use_vulkan_compute;
          local_218 = *(Allocator **)&opt->use_bf16_storage;
          _iStack_210 = *(undefined8 *)&opt->vulkan_device_index;
          _iStack_208 = *(undefined8 *)&opt->flush_denormals;
          _iStack_200 = *(undefined8 *)&opt->use_winograd43_convolution;
          pAStack_230 = opt->workspace_allocator;
          convert_packing(&local_2d8,(Mat *)&opt_q,uVar27,(Option *)&top_rescale);
          if (opt_q._0_8_ != 0) {
            uVar42 = uVar34 & 0xffffffff;
            if ((long)(int)opt_q._56_4_ * sVar15 != 0) goto LAB_003b2d56;
          }
          iVar22 = -100;
        }
        else {
LAB_003b2d56:
          piVar3 = top_blob->refcount;
          _top_rescale = top_blob->data;
          pAStack_230 = (Allocator *)top_blob->refcount;
          pAStack_228 = (Allocator *)top_blob->elemsize;
          iStack_220 = top_blob->elempack;
          local_218 = top_blob->allocator;
          iStack_210 = top_blob->dims;
          iStack_20c = top_blob->w;
          iStack_208 = top_blob->h;
          iStack_204 = top_blob->d;
          iStack_200 = top_blob->c;
          local_1f8 = top_blob->cstep;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          if (_elempack < uVar9) {
            local_318 = (byte)uVar47;
            Mat::create((Mat *)&top_rescale,iVar28,iVar41,
                        (this->super_ConvolutionDepthWise).num_output / (int)_elempack,
                        (ulong)((byte)((ushort)uVar49 / (ushort)local_318) * _elempack),_elempack,
                        opt->workspace_allocator);
            iVar22 = -100;
            if (_top_rescale != (void *)0x0) {
              uVar42 = uVar34 & 0xffffffff;
              if ((long)iStack_200 * local_1f8 != 0) goto LAB_003b2e31;
            }
          }
          else {
LAB_003b2e31:
            iVar45 = 0;
            iVar25 = 0;
            lVar33 = 0;
            do {
              auVar17 = (undefined1  [32])opt_q._32_32_;
              if ((this->super_ConvolutionDepthWise).group <= lVar33) {
                if (_elempack < uVar9) {
                  convert_packing((Mat *)&top_rescale,top_blob,uVar9,opt);
                  iVar22 = -100;
                  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
                  break;
                }
                else if ((Mat *)&top_rescale != top_blob) {
                  if (pAStack_230 != (Allocator *)0x0) {
                    LOCK();
                    *(int *)&pAStack_230->_vptr_Allocator =
                         *(int *)&pAStack_230->_vptr_Allocator + 1;
                    UNLOCK();
                  }
                  piVar3 = top_blob->refcount;
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (top_blob->allocator == (Allocator *)0x0) {
                        free(top_blob->data);
                      }
                      else {
                        (*top_blob->allocator->_vptr_Allocator[3])();
                      }
                    }
                  }
                  top_blob->data = _top_rescale;
                  top_blob->refcount = (int *)pAStack_230;
                  top_blob->elemsize = (size_t)pAStack_228;
                  top_blob->elempack = iStack_220;
                  top_blob->allocator = local_218;
                  top_blob->dims = iStack_210;
                  top_blob->w = iStack_20c;
                  top_blob->h = iStack_208;
                  top_blob->d = iStack_204;
                  top_blob->c = iStack_200;
                  top_blob->cstep = local_1f8;
                }
                iVar22 = 0;
                break;
              }
              local_178 = (int)uVar42 / (int)uVar27;
              _scale_out = (void *)((long)(iVar45 / (int)uVar27) * sVar15 *
                                    (long)opt_q.workspace_allocator + opt_q._0_8_);
              local_1a8 = (int *)0x0;
              local_1a0 = opt_q.workspace_allocator;
              local_198 = opt_q.openmp_blocktime;
              local_190 = (long *)opt_q._32_8_;
              uVar16 = opt_q._40_8_;
              uVar18 = opt_q._48_8_;
              local_170 = ((long)(int)opt_q._52_4_ * (long)opt_q.workspace_allocator *
                           (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU &
                          0xfffffffffffffff0) / (ulong)opt_q.workspace_allocator;
              opt_q.vulkan_device_index = (int)uVar16;
              opt_q.use_reserved_1 = SUB81(uVar16,4);
              opt_q.use_image_storage = SUB81(uVar16,5);
              opt_q.use_tensor_storage = SUB81(uVar16,6);
              opt_q.use_reserved_2 = SUB81(uVar16,7);
              local_188 = opt_q.vulkan_device_index;
              bStack_184 = opt_q.use_reserved_1;
              bStack_183 = opt_q.use_image_storage;
              bStack_182 = opt_q.use_tensor_storage;
              bStack_181 = opt_q.use_reserved_2;
              opt_q.flush_denormals = (int)uVar18;
              opt_q.use_local_pool_allocator = SUB81(uVar18,4);
              opt_q.use_shader_local_memory = SUB81(uVar18,5);
              opt_q.use_cooperative_matrix = SUB81(uVar18,6);
              opt_q.use_winograd23_convolution = SUB81(uVar18,7);
              iStack_180 = opt_q.flush_denormals;
              bStack_17c = opt_q.use_local_pool_allocator;
              bStack_17b = opt_q.use_shader_local_memory;
              bStack_17a = opt_q.use_cooperative_matrix;
              bStack_179 = opt_q.use_winograd23_convolution;
              m_1.c = (int)uVar46 / (int)_elempack;
              m_1.data = (void *)((long)(iVar25 / (int)_elempack) * local_1f8 * (long)pAStack_228 +
                                 (long)_top_rescale);
              m_1.refcount = (int *)0x0;
              m_1.elemsize = (size_t)pAStack_228;
              m_1.elempack = iStack_220;
              m_1.allocator = local_218;
              m_1.cstep = ((long)iStack_204 * (long)pAStack_228 *
                           (long)iStack_208 * (long)iStack_20c + 0xfU & 0xfffffffffffffff0) /
                          (ulong)pAStack_228;
              m_1.dims = iStack_210;
              m_1.w = iStack_20c;
              m_1.h = iStack_208;
              m_1.d = iStack_204;
              pLVar7 = (this->group_ops).
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar33];
              opt_g.lightmode = opt->lightmode;
              opt_g.use_shader_pack8 = opt->use_shader_pack8;
              opt_g.use_subgroup_ops = opt->use_subgroup_ops;
              opt_g.use_reserved_0 = opt->use_reserved_0;
              opt_g.num_threads = opt->num_threads;
              opt_g.workspace_allocator = opt->workspace_allocator;
              opt_g.openmp_blocktime = opt->openmp_blocktime;
              opt_g.use_winograd_convolution = opt->use_winograd_convolution;
              opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
              opt_g.use_int8_inference = opt->use_int8_inference;
              opt_g.use_vulkan_compute = opt->use_vulkan_compute;
              opt_g.use_bf16_storage = opt->use_bf16_storage;
              opt_g.use_fp16_packed = opt->use_fp16_packed;
              opt_g.use_fp16_storage = opt->use_fp16_storage;
              opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
              opt_g.use_int8_packed = opt->use_int8_packed;
              opt_g.use_int8_storage = opt->use_int8_storage;
              opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g.use_packing_layout = opt->use_packing_layout;
              opt_g.vulkan_device_index = opt->vulkan_device_index;
              opt_g.use_reserved_1 = opt->use_reserved_1;
              opt_g.use_image_storage = opt->use_image_storage;
              opt_g.use_tensor_storage = opt->use_tensor_storage;
              opt_g.use_reserved_2 = opt->use_reserved_2;
              opt_g.flush_denormals = opt->flush_denormals;
              opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
              opt_g.use_shader_local_memory = opt->use_shader_local_memory;
              opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
              opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
              opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
              opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
              opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
              opt_g.use_fp16_uniform = opt->use_fp16_uniform;
              opt_g.use_int8_uniform = opt->use_int8_uniform;
              opt_g.use_reserved_9 = opt->use_reserved_9;
              opt_g.use_reserved_10 = opt->use_reserved_10;
              opt_g.use_reserved_11 = opt->use_reserved_11;
              opt_g.blob_allocator = local_218;
              opt_q._32_32_ = auVar17;
              iVar22 = (*pLVar7->_vptr_Layer[7])(pLVar7,&scale_out,&m_1,&opt_g);
              if (m_1.refcount != (int *)0x0) {
                LOCK();
                *m_1.refcount = *m_1.refcount + -1;
                UNLOCK();
                if (*m_1.refcount == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    free(m_1.data);
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              if (local_1a8 != (int *)0x0) {
                LOCK();
                *local_1a8 = *local_1a8 + -1;
                UNLOCK();
                if (*local_1a8 == 0) {
                  if (local_190 == (long *)0x0) {
                    free(_scale_out);
                  }
                  else {
                    (**(code **)(*local_190 + 0x18))();
                  }
                }
              }
              lVar33 = lVar33 + 1;
              iVar25 = iVar25 + uVar46;
              iVar45 = iVar45 + (int)uVar34;
              uVar42 = local_350;
            } while (iVar22 == 0);
          }
          if (pAStack_230 != (Allocator *)0x0) {
            LOCK();
            *(int *)&pAStack_230->_vptr_Allocator = *(int *)&pAStack_230->_vptr_Allocator + -1;
            UNLOCK();
            if (*(int *)&pAStack_230->_vptr_Allocator == 0) {
              if (local_218 == (Allocator *)0x0) {
                free(_top_rescale);
              }
              else {
                (*local_218->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_q._32_8_ == 0) {
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_2d8.allocator == (Allocator *)0x0) {
        free(local_2d8.data);
      }
      else {
        (*(local_2d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003b427f:
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        free(local_168.data);
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

int ConvolutionDepthWise_x86_fma::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}